

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O0

void word_boundary(void)

{
  ostream *poVar1;
  int word3 [8];
  int none3 [8];
  string all3 [8];
  string all2 [1];
  int zero [25];
  int ideo1 [9];
  int kana1 [9];
  int word1 [9];
  int num1 [9];
  int none1 [9];
  string all1 [9];
  generator g;
  undefined4 in_stack_fffffffffffff610;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffff614;
  generator *in_stack_fffffffffffff618;
  generator *local_960;
  string *local_948;
  string *local_930;
  int *in_stack_fffffffffffff788;
  string *ideo;
  int *in_stack_fffffffffffff790;
  int *kana;
  int *in_stack_fffffffffffff798;
  string *word;
  int *in_stack_fffffffffffff7a0;
  string *num;
  int *in_stack_fffffffffffff7a8;
  int *none;
  string *in_stack_fffffffffffff7b0;
  string *original;
  locale *in_stack_fffffffffffff7c0;
  string *l;
  boundary_type in_stack_fffffffffffff7c8;
  boundary_type b;
  allocator local_5e1;
  string local_5e0 [32];
  locale local_5c0 [15];
  allocator local_5b1;
  string local_5b0 [32];
  locale local_590 [15];
  allocator local_581;
  string local_580 [32];
  locale local_560 [15];
  allocator local_551;
  string local_550 [32];
  locale local_530 [15];
  allocator local_521;
  string local_520 [32];
  locale local_500 [15];
  allocator local_4f1;
  string local_4f0 [32];
  locale local_4d0 [15];
  allocator local_4c1;
  string local_4c0 [32];
  locale local_4a0 [15];
  allocator local_491;
  string local_490 [32];
  locale local_470 [15];
  allocator local_461;
  string local_460 [32];
  locale local_440 [8];
  int local_438 [19];
  undefined1 local_3e9;
  allocator local_3e8;
  allocator local_3e7;
  allocator local_3e6;
  allocator local_3e5;
  allocator local_3e4;
  allocator local_3e3;
  allocator local_3e2;
  allocator local_3e1;
  string *local_3e0;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string asStack_2d8 [6];
  undefined1 local_2d2;
  allocator local_2d1;
  string *local_2d0;
  string local_2c8;
  string local_2a8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined1 local_14d;
  allocator local_14c;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  allocator local_148;
  allocator local_147;
  allocator local_146;
  allocator local_145 [20];
  allocator local_131;
  string *local_130;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  generator local_8 [8];
  
  booster::locale::generator::generator(local_8);
  local_14d = 1;
  local_130 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"10",&local_131);
  local_130 = local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108," ",local_145);
  local_130 = local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Hello",&local_146);
  local_130 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8," ",&local_147);
  local_130 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Windows7",&local_148);
  local_130 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88," ",&local_149);
  local_130 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,anon_var_dwarf_133f9,&local_14a);
  local_130 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,anon_var_dwarf_13413,&local_14b);
  local_130 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_14c);
  local_14d = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_14c);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b);
  std::allocator<char>::~allocator((allocator<char> *)&local_14a);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_147);
  std::allocator<char>::~allocator((allocator<char> *)&local_146);
  std::allocator<char>::~allocator((allocator<char> *)local_145);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  uStack_160 = 0;
  local_158 = 0;
  local_178 = 0x100000000;
  uStack_170 = 0x100000000;
  local_168 = 0x100000000;
  uStack_190 = 0;
  uStack_1a0 = 0;
  local_188 = 0;
  local_1a8 = 1;
  local_198 = 1;
  uStack_1c0 = 0;
  local_1d8 = 0;
  local_1b8 = 0;
  uStack_1d0 = 1;
  local_1c8 = 1;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1e8 = 0;
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0;
  uStack_220 = 0x100000001;
  local_218 = 1;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  local_2a8.field_2._8_8_ = 0;
  local_2a8._M_dataplus = (_Alloc_hider)0x0;
  local_2a8._1_7_ = 0;
  local_2a8._M_string_length = 0;
  local_248 = 0;
  local_2d2 = 1;
  local_2d0 = &local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"",&local_2d1);
  local_2d2 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_3e9 = 1;
  local_3e0 = local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8," ",&local_3e1);
  local_3e0 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8," ",&local_3e2);
  local_3e0 = local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"Hello",&local_3e3);
  local_3e0 = local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,",",&local_3e4);
  local_3e0 = local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"World",&local_3e5);
  local_3e0 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"!",&local_3e6);
  local_3e0 = local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318," ",&local_3e7);
  local_3e0 = local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"",&local_3e8);
  local_3e9 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e7);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e6);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e5);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e4);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e3);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  local_438[0xc] = 0;
  local_438[0xd] = 1;
  local_438[0xe] = 1;
  local_438[0xf] = 0;
  local_438[8] = 1;
  local_438[9] = 1;
  local_438[10] = 0;
  local_438[0xb] = 1;
  local_438[4] = 1;
  local_438[5] = 0;
  local_438[6] = 0;
  local_438[7] = 0;
  local_438[0] = 0;
  local_438[1] = 0;
  local_438[2] = 1;
  local_438[3] = 0;
  poVar1 = std::operator<<((ostream *)&std::cout," char UTF-8");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"ja_JP.UTF-8",&local_461);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,
             (string *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  uVar2 = 1;
  run_word<char>(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                 in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8);
  std::locale::~locale(local_440);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"en_US.UTF-8",&local_491);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<char>(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                 in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8);
  std::locale::~locale(local_470);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"en_US.UTF-8",&local_4c1);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<char>(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                 in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8);
  std::locale::~locale(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  poVar1 = std::operator<<((ostream *)&std::cout," char Shift-JIS");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"ja_JP.Shift-JIS",&local_4f1);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<char>(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                 in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8);
  std::locale::~locale(local_4d0);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  l = &local_2c8;
  b = (boundary_type)&local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"ja_JP.Shift-JIS",&local_521);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<char>(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                 (locale *)l,b);
  std::locale::~locale(local_500);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  ideo = local_3d8;
  kana = local_438 + 8;
  word = &local_2a8;
  none = local_438;
  num = word;
  original = word;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"ja_JP.Shift-JIS",&local_551);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<char>(original,none,(int *)num,(int *)word,kana,(int *)ideo,(locale *)l,b);
  std::locale::~locale(local_530);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  poVar1 = std::operator<<((ostream *)&std::cout," wchar_t");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"ja_JP.UTF-8",&local_581);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<wchar_t>(original,none,(int *)num,(int *)word,kana,(int *)ideo,(locale *)l,b);
  std::locale::~locale(local_560);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"en_US.UTF-8",&local_5b1);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  uVar2 = 1;
  run_word<wchar_t>(original,none,(int *)num,(int *)word,kana,(int *)ideo,(locale *)l,b);
  std::locale::~locale(local_590);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"en_US.UTF-8",&local_5e1);
  booster::locale::generator::operator()
            (in_stack_fffffffffffff618,(string *)CONCAT44(in_stack_fffffffffffff614,uVar2));
  run_word<wchar_t>(original,none,(int *)num,(int *)word,kana,(int *)ideo,(locale *)l,b);
  std::locale::~locale(local_5c0);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  local_930 = asStack_2d8;
  do {
    local_930 = local_930 + -0x20;
    std::__cxx11::string::~string(local_930);
  } while (local_930 != local_3d8);
  local_948 = &local_2a8;
  do {
    local_948 = local_948 + -1;
    std::__cxx11::string::~string((string *)local_948);
  } while (local_948 != &local_2c8);
  local_960 = local_8;
  do {
    local_960 = local_960 + -0x20;
    std::__cxx11::string::~string((string *)local_960);
  } while (local_960 != (generator *)local_128);
  booster::locale::generator::~generator(local_8);
  return;
}

Assistant:

void word_boundary()
{
    booster::locale::generator g;
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひらがな","ヒラガナ",""};
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひん","アヒル",""};
    std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","アヒル",""};
    int        none1[]={ 0,   1,      0,  1,         0,   1,      0,         0,          0};
    int         num1[]={ 1,   0,      0,  0,         1,   0,      0 ,        0 ,         0};
    int        word1[]={ 0,   0,      1,  0,         1,   0,      0 ,        0 ,         0};
#if U_ICU_VERSION_MAJOR_NUM >= 50
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         0 ,         0}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         1 ,         1}; 
#else
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         1 ,         1}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         0 ,         0}; 
#endif


    int zero[25]={0};
    std::string all2[]={""};

    std::string all3[]={" "," ","Hello",",","World","!"," ",""};
    int        none3[]={ 1,  1,      0,  1,      0,   1,  1, 0};
    int        word3[]={ 0,  0,      1,  0,      1,   0,  0, 0};

    std::cout << " char UTF-8" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    std::cout << " char Shift-JIS" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.Shift-JIS"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("ja_JP.Shift-JIS"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("ja_JP.Shift-JIS"));

    std::cout << " wchar_t"<<std::endl;
    run_word<wchar_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<wchar_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<wchar_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    #ifdef BOOSTER_HAS_CHAR16_T
    std::cout << " char16_t"<<std::endl;
    run_word<char16_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char16_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char16_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 

    #ifdef BOOSTER_HAS_CHAR32_T
    std::cout << " char32_t"<<std::endl;
    run_word<char32_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char32_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char32_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 
}